

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall fnv_hash_check::test_method(fnv_hash_check *this)

{
  uint32_t expected;
  undefined4 local_130;
  undefined4 local_12c;
  undefined1 local_128;
  undefined8 local_120;
  shared_count sStack_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  char *local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined ***local_b0;
  undefined4 *local_a8;
  undefined **local_a0;
  undefined1 local_98;
  undefined ***local_90;
  char *local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined ***local_70;
  char *local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined ***local_50;
  undefined4 *local_48;
  undefined **local_40;
  undefined1 local_38;
  undefined ***local_30;
  char *local_28;
  
  local_130 = 0xd39f0e56;
  local_12c = 0xd39f0e56;
  local_f0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x72);
  local_128 = 1;
  local_120 = 0;
  sStack_118.pi_ = (sp_counted_base *)0x0;
  local_b0 = &local_e0;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0013d750;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "\nexpected: ";
  local_90 = &local_c0;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0013d790;
  local_70 = &local_a0;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_0013d7d0;
  local_88 = "\n";
  local_50 = &local_80;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_0013d810;
  local_68 = "actual: ";
  local_30 = &local_60;
  local_58 = 0;
  local_60 = &PTR__lazy_ostream_0013d850;
  local_38 = 0;
  local_40 = &PTR__lazy_ostream_0013d890;
  local_28 = "\n";
  local_110 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_108 = "";
  local_a8 = &local_130;
  local_48 = &local_12c;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_118);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(fnv_hash_check) {
	uint32_t x = 1235U;
	const uint32_t
			y = 9999999U,
			expected = (FNV_PRIME * x) ^y;

	x = fnv_hash(x, y);

	BOOST_REQUIRE_MESSAGE(x == expected,
			"\nexpected: " << expected << "\n"
					<< "actual: " << x << "\n");

}